

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O3

void DiffTestRecurse<Blob<64>,Blob<128>>
               (pfHash hash,Blob<64> *k1,Blob<64> *k2,Blob<128> *h1,Blob<128> *h2,int start,
               int bitsleft,vector<Blob<64>,_std::allocator<Blob<64>_>_> *diffs)

{
  uint32_t start_00;
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  Blob<64> t;
  
  if (start < 0x40) {
    do {
      flipbit(k2,8,start);
      (*hash)(k2,8,0,h2);
      if (h1->bytes[0] == h2->bytes[0]) {
        uVar4 = 0xffffffffffffffff;
        do {
          if (uVar4 == 0xe) goto LAB_0013b6b3;
          lVar2 = uVar4 + 2;
          uVar1 = uVar4 + 1;
          lVar3 = uVar4 + 2;
          uVar4 = uVar1;
        } while (h1->bytes[lVar2] == h2->bytes[lVar3]);
        if (0xe < uVar1) {
LAB_0013b6b3:
          t.bytes = (uint8_t  [8])(*(ulong *)k2->bytes ^ *(ulong *)k1->bytes);
          std::vector<Blob<64>,std::allocator<Blob<64>>>::emplace_back<Blob<64>>
                    ((vector<Blob<64>,std::allocator<Blob<64>>> *)diffs,&t);
        }
      }
      start_00 = start + 1;
      if (bitsleft + -1 != 0) {
        DiffTestRecurse<Blob<64>,Blob<128>>(hash,k1,k2,h1,h2,start_00,bitsleft + -1,diffs);
      }
      flipbit(k2,8,start);
      start = start_00;
    } while (start_00 != 0x40);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}